

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O3

void __thiscall
libsgp4::SGP4::DeepSpaceInitialise
          (SGP4 *this,double eosq,double sinio,double cosio,double betao,double theta2,double betao2
          ,double xmdot,double omgdot,double xnodot)

{
  undefined1 auVar1 [16];
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double local_268;
  double dStack_260;
  double local_238;
  double dStack_230;
  double local_1f8;
  double local_1a8;
  double local_198;
  double dStack_170;
  
  dVar3 = 1.0 / (this->elements_).recovered_semi_major_axis_;
  dVar4 = sin((this->elements_).ascending_node_);
  dVar5 = cos((this->elements_).ascending_node_);
  dVar6 = sin((this->elements_).argument_perigee_);
  dVar7 = cos((this->elements_).argument_perigee_);
  dVar16 = (double)(this->elements_).epoch_.m_encoded / 86400000000.0 + 1721425.5 + -2415020.0;
  dVar17 = dVar16 * -0.00092422029 + 4.523602;
  dVar8 = floor(dVar17 / 6.283185307179586);
  dVar17 = dVar8 * -6.283185307179586 + dVar17;
  dVar9 = sin(dVar17);
  dVar10 = cos(dVar17);
  dVar8 = dVar10 * -0.03568096 + 0.91375164;
  dVar11 = 1.0 - dVar8 * dVar8;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  dVar35 = (dVar9 * 0.089683511) / dVar11;
  dVar12 = 1.0 - dVar35 * dVar35;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  dVar19 = dVar16 * 0.001944368 + 5.8351514;
  dVar18 = (dVar16 * 0.2299715 + 4.7199672) - dVar19;
  dVar13 = floor(dVar18 / 6.283185307179586);
  (this->deepspace_consts_).zmol = dVar13 * -6.283185307179586 + dVar18;
  dVar9 = atan2((dVar9 * 0.39785416) / dVar11,dVar10 * dVar12 + dVar35 * 0.91744867 * dVar9);
  dVar17 = (dVar9 + dVar19) - dVar17;
  dVar14 = cos(dVar17);
  dVar15 = sin(dVar17);
  dVar16 = dVar16 * 0.017201977 + 6.2565837;
  dVar9 = floor(dVar16 / 6.283185307179586);
  (this->deepspace_consts_).zmos = dVar9 * -6.283185307179586 + dVar16;
  dVar16 = (this->elements_).recovered_mean_motion_;
  dVar9 = (this->elements_).eccentricity_;
  dVar10 = (this->elements_).inclination_;
  auVar1._8_4_ = SUB84(cosio,0);
  auVar1._0_8_ = cosio;
  auVar1._12_4_ = (int)((ulong)cosio >> 0x20);
  bVar2 = false;
  local_1f8 = 2.9864797e-06;
  local_1a8 = 1.19459e-05;
  local_198 = 0.01675;
  dVar17 = 0.91744867;
  dVar19 = dVar4;
  dVar13 = dVar5;
  dVar18 = 0.39785416;
  dVar37 = -0.98088458;
  dVar20 = 0.1945905;
  while( true ) {
    dVar34 = dVar20 * dVar13 + dVar19 * dVar17 * dVar37;
    dVar36 = -dVar37 * dVar13 + dVar19 * dVar17 * dVar20;
    dVar43 = -dVar20 * dVar19 + dVar13 * dVar17 * dVar37;
    dVar17 = dVar37 * dVar19 + dVar13 * dVar17 * dVar20;
    dStack_170 = auVar1._8_8_;
    dVar28 = cosio * dVar43 + dVar18 * dVar37 * sinio;
    dVar29 = dStack_170 * dVar17 + dVar18 * dVar20 * sinio;
    dVar19 = dVar34 * dVar7 + dVar6 * dVar28;
    dVar38 = dVar7 * dVar28 - dVar34 * dVar6;
    dVar40 = dVar7 * dVar29 - dVar36 * dVar6;
    dVar44 = dVar43 * -sinio + dVar18 * dVar37 * cosio;
    dVar46 = dVar17 * -sinio + dVar18 * dVar20 * dStack_170;
    dVar20 = dVar7 * dVar44;
    dVar22 = dVar7 * dVar46;
    dVar47 = dVar46 * dVar6;
    dVar27 = dVar7 * dVar36 + dVar6 * dVar29;
    dVar17 = dVar44 * dVar6;
    dVar18 = dVar38 * -6.0;
    dVar30 = dVar19 * 12.0 * dVar19 + dVar38 * -3.0 * dVar38;
    dVar32 = dVar27 * 12.0 * dVar27 + dVar40 * -3.0 * dVar40;
    dVar45 = dVar19 * 24.0 * dVar27 + dVar18 * dVar40;
    dVar13 = (dVar34 * dVar36 + dVar29 * dVar28) * 6.0 + dVar45 * eosq;
    local_1f8 = local_1f8 * (1.0 / dVar16);
    dVar23 = dVar34 * -6.0 * dVar44 + (dVar19 * -24.0 * dVar20 + dVar17 * dVar18) * eosq;
    dVar25 = dVar36 * -6.0 * dVar46 + (dVar27 * -24.0 * dVar22 + dVar47 * dVar40 * -6.0) * eosq;
    dVar41 = (local_1f8 * -0.5) / betao;
    dVar26 = local_1f8 * betao;
    dVar48 = dVar28 * 6.0 * dVar44 + (dVar17 * dVar19 * 24.0 + dVar18 * dVar20) * eosq;
    dVar49 = dVar29 * 6.0 * dVar46 + (dVar27 * 24.0 * dVar47 + dVar40 * -6.0 * dVar22) * eosq;
    dVar18 = (dVar34 * dVar34 + dVar28 * dVar28) * 3.0 + dVar30 * eosq;
    dVar37 = (dVar36 * dVar36 + dVar29 * dVar29) * 3.0 + dVar32 * eosq;
    dVar18 = betao2 * dVar30 + dVar18 + dVar18;
    dVar37 = betao2 * dVar32 + dVar37 + dVar37;
    dVar43 = dVar26 * dVar9 * -15.0;
    dVar42 = 0.0;
    if (dVar10 <= 3.0892327765897933 && 0.052359877 <= dVar10) {
      dVar42 = ((dVar48 + dVar49) * -local_1a8 * dVar41) / sinio;
    }
    dVar39 = local_1a8 * dVar43 * (dVar19 * dVar38 + dVar40 * dVar27);
    dVar31 = local_1a8 * dVar41 * (dVar23 + dVar25);
    dVar33 = -local_1a8 * local_1f8 * (eosq * -6.0 + dVar18 + dVar37 + -14.0);
    dVar24 = local_1a8 * dVar26 * (dVar30 + dVar32 + -6.0);
    dVar21 = (dVar43 + dVar43) * (dVar40 * dVar19 + dVar27 * dVar38);
    dVar43 = (dVar43 + dVar43) * (-dVar19 * dVar38 + dVar27 * dVar40);
    local_1f8 = local_1f8 * -2.0;
    dVar37 = local_1f8 * (dVar37 - dVar18);
    dVar34 = ((dVar46 * dVar34 + dVar36 * dVar44) * -6.0 +
             ((dVar27 * dVar20 + dVar19 * dVar22) * -24.0 +
             (dVar38 * dVar47 + dVar17 * dVar40) * -6.0) * eosq) * dVar41 * 2.0;
    dVar18 = (dVar25 - dVar23) * dVar41 * 2.0;
    dVar13 = (betao2 * dVar45 + dVar13 + dVar13) * local_1f8;
    dVar23 = (dVar32 - dVar30) * dVar26 * 2.0;
    dVar25 = local_198 * dVar26 * -18.0;
    dVar45 = dVar26 * 2.0 * dVar45;
    dVar17 = dVar41 * -2.0 *
             ((dVar44 * dVar29 + dVar46 * dVar28) * 6.0 +
             eosq * ((dVar27 * dVar17 + dVar47 * dVar19) * 24.0 +
                    (dVar40 * dVar20 + dVar22 * dVar38) * -6.0));
    dVar19 = (dVar49 - dVar48) * dVar41 * -2.0;
    local_198 = local_198 * local_1f8 * (eosq * -9.0 + -21.0);
    if (bVar2) break;
    (this->deepspace_consts_).sse = dVar39;
    (this->deepspace_consts_).ssi = dVar31;
    (this->deepspace_consts_).ssl = dVar33;
    (this->deepspace_consts_).ssh = dVar42;
    (this->deepspace_consts_).ssg = dVar42 * -cosio + dVar24;
    (this->deepspace_consts_).se2 = dVar21;
    (this->deepspace_consts_).si2 = dVar34;
    (this->deepspace_consts_).sl2 = dVar13;
    (this->deepspace_consts_).sgh2 = dVar45;
    (this->deepspace_consts_).sh2 = dVar17;
    (this->deepspace_consts_).se3 = dVar43;
    (this->deepspace_consts_).si3 = dVar18;
    (this->deepspace_consts_).sl3 = dVar37;
    (this->deepspace_consts_).sgh3 = dVar23;
    (this->deepspace_consts_).sh3 = dVar19;
    (this->deepspace_consts_).sl4 = local_198;
    (this->deepspace_consts_).sgh4 = dVar25;
    bVar2 = true;
    local_198 = 0.0549;
    local_1a8 = 0.00015835218;
    local_1f8 = 4.7968065e-07;
    dVar17 = dVar8;
    dVar19 = dVar12 * dVar4 + -dVar5 * dVar35;
    dVar13 = dVar12 * dVar5 + dVar4 * dVar35;
    dVar18 = dVar11;
    dVar37 = dVar15;
    dVar20 = dVar14;
  }
  (this->deepspace_consts_).ee2 = dVar21;
  (this->deepspace_consts_).e3 = dVar43;
  (this->deepspace_consts_).xi2 = dVar34;
  (this->deepspace_consts_).xi3 = dVar18;
  (this->deepspace_consts_).xl2 = dVar13;
  (this->deepspace_consts_).xl3 = dVar37;
  (this->deepspace_consts_).xl4 = local_198;
  (this->deepspace_consts_).xgh2 = dVar45;
  (this->deepspace_consts_).xgh3 = dVar23;
  (this->deepspace_consts_).xgh4 = dVar25;
  (this->deepspace_consts_).xh2 = dVar17;
  (this->deepspace_consts_).xh3 = dVar19;
  (this->deepspace_consts_).sse = dVar39 + (this->deepspace_consts_).sse;
  dVar33 = dVar33 + (this->deepspace_consts_).ssl;
  (this->deepspace_consts_).ssi = dVar31 + (this->deepspace_consts_).ssi;
  (this->deepspace_consts_).ssl = dVar33;
  dVar8 = -cosio * dVar42 + dVar24 + (this->deepspace_consts_).ssg;
  dVar42 = dVar42 + (this->deepspace_consts_).ssh;
  (this->deepspace_consts_).ssg = dVar8;
  (this->deepspace_consts_).ssh = dVar42;
  (this->deepspace_consts_).shape = NONE;
  if ((0.0052359877 <= dVar16) || (dVar16 <= 0.0034906585)) {
    if (dVar16 < 0.00826) {
      return;
    }
    if (0.00924 < dVar16) {
      return;
    }
    dVar8 = (this->elements_).eccentricity_;
    if (dVar8 < 0.5) {
      return;
    }
    (this->deepspace_consts_).shape = RESONANCE;
    dVar5 = dVar8 * dVar8;
    dVar4 = dVar8 * dVar5;
    if (dVar8 <= 0.65) {
      local_268 = dVar4 * 156.591 + dVar5 * -228.419 + dVar8 * 117.39 + -19.302;
      dStack_260 = dVar4 * 146.5816 + dVar5 * -214.6334 + dVar8 * 109.7927 + -18.9068;
      dVar6 = dVar4 * 313.953 + dVar5 * -471.094 + dVar8 * 242.694 + -41.122;
      dVar7 = dVar4 * 1083.435 + dVar5 * -1629.014 + dVar8 * 841.88 + -146.407;
      dVar9 = dVar4 * 0.0 + dVar5 * 16.29 + dVar8 * -13.247 + 3.616;
      dVar10 = dVar4 * 3708.276 + dVar5 * -5740.032 + dVar8 * 3017.977 + -532.114;
    }
    else {
      dVar9 = dVar4 * 266.724 + dVar5 * -508.738 + dVar8 * 331.819 + -72.099;
      local_268 = dVar4 * 1246.113 + dVar5 * -2415.925 + dVar8 * 1582.851 + -346.844;
      dStack_260 = dVar4 * 1215.972 + dVar5 * -2366.899 + dVar8 * 1554.908 + -342.585;
      dVar6 = dVar4 * 3651.957 + dVar5 * -7193.992 + dVar8 * 4758.686 + -1052.797;
      dVar7 = dVar4 * 12422.52 + dVar5 * -24462.77 + dVar8 * 16178.11 + -3581.69;
      if (dVar8 <= 0.715) {
        dVar10 = dVar5 * 3763.64 + dVar8 * -4664.75 + 1464.74;
        dVar11 = 0.0;
      }
      else {
        dVar10 = dVar5 * -54087.36 + dVar8 * 29936.92 + -5149.66;
        dVar11 = 31324.56;
      }
      dVar10 = dVar11 * dVar4 + dVar10;
    }
    if (0.7 <= dVar8) {
      local_238 = dVar4 * 146349.42 + dVar5 * -309468.16 + dVar8 * 218913.95 + -51752.104;
      dStack_230 = dVar4 * 109377.94 + dVar5 * -229838.2 + dVar8 * 161616.52 + -37995.78;
      dVar5 = dVar5 * -242699.48 + dVar8 * 170470.89 + -40023.88;
      dVar4 = dVar4 * 115605.82;
    }
    else {
      local_238 = dVar4 * 5337.524 + dVar5 * -8491.4146 + dVar8 * 4568.6173 + -822.71072;
      dStack_230 = dVar4 * 5542.21 + dVar5 * -9064.77 + dVar8 * 4988.61 + -919.2277;
      dVar5 = dVar5 * -8624.77 + dVar8 * 4690.25 + -853.666;
      dVar4 = dVar4 * 5341.4;
    }
    dVar11 = cosio * -2.0 + 1.0;
    dVar17 = dStack_170 * 2.0 + 1.0;
    dVar35 = dVar16 * dVar16 * 3.0 * dVar3 * dVar3;
    dVar12 = sinio * sinio;
    dVar13 = (dVar17 + theta2) * 0.75;
    dVar19 = dVar35 * 1.7891679e-06;
    dVar35 = dVar3 * dVar35;
    dVar18 = dVar3 * dVar35;
    dVar35 = dVar35 * 3.7393792e-07;
    (this->deepspace_consts_).d2201 = ((dVar8 + -0.64) * -0.44 + -0.306) * dVar13 * dVar19;
    (this->deepspace_consts_).d2211 = dVar9 * dVar19 * dVar12 * 1.5;
    dVar17 = theta2 * -3.0 + dVar17;
    (this->deepspace_consts_).d3210 = dVar35 * sinio * 1.875 * (theta2 * -3.0 + dVar11) * local_268;
    (this->deepspace_consts_).d3222 = dVar35 * sinio * -1.875 * dVar17 * dStack_260;
    dVar3 = dVar3 * dVar18;
    dVar8 = (dVar18 + dVar18) * 7.3636953e-09;
    (this->deepspace_consts_).d4410 = dVar8 * dVar13 * dVar12 * 35.0 * dVar6;
    (this->deepspace_consts_).d4422 = dVar8 * dVar12 * dVar12 * 39.375 * dVar7;
    (this->deepspace_consts_).d5220 =
         dVar10 * dVar3 * 1.1428639e-07 *
                  sinio * 9.84375 *
                  (dVar12 * (theta2 * -5.0 + dVar11) +
                  (theta2 * 6.0 + cosio * 4.0 + -2.0) * 0.33333333);
    (this->deepspace_consts_).d5232 =
         (dVar4 + dVar5) *
         dVar3 * 1.1428639e-07 *
         sinio * (dVar12 * 4.92187512 * (theta2 * 10.0 + cosio * -4.0 + -2.0) + dVar17 * 6.56250012)
    ;
    dVar8 = (dVar3 + dVar3) * 2.1765803e-09;
    (this->deepspace_consts_).d5421 =
         dVar8 * sinio * 29.53125 *
                 ((theta2 * 10.0 + cosio * 8.0 + -12.0) * theta2 + cosio * -8.0 + 2.0) * local_238;
    (this->deepspace_consts_).d5433 =
         dVar8 * sinio * 29.53125 *
                 ((theta2 * -10.0 + dStack_170 * 8.0 + 12.0) * theta2 + dStack_170 * -8.0 + -2.0) *
         dStack_230;
    dVar8 = (this->elements_).ascending_node_;
    dVar3 = (this->deepspace_consts_).gsto;
    dVar3 = (((this->elements_).mean_anomoly_ + dVar8 + dVar8) - dVar3) - dVar3;
    dVar8 = floor(dVar3 / 6.283185307179586);
    (this->deepspace_consts_).xlamo = dVar8 * -6.283185307179586 + dVar3;
    if ((this->deepspace_consts_).shape == NONE) {
      return;
    }
    dVar8 = dVar33 + xmdot + xnodot + xnodot + -0.0043752690880113 + -0.0043752690880113 + dVar42;
  }
  else {
    (this->deepspace_consts_).shape = SYNCHRONOUS;
    dVar4 = cosio + 1.0;
    dVar5 = dVar16 * 3.0 * dVar16 * dVar3 * dVar3;
    (this->deepspace_consts_).del3 =
         dVar5 * 3.0 * dVar4 * 1.875 * dVar4 * dVar4 * ((eosq * 6.60937 + -6.0) * eosq + 1.0) *
         2.2123015e-07 * dVar3;
    (this->deepspace_consts_).del1 =
         dVar3 * ((cosio * 3.0 + 1.0) * sinio * 0.9375 * sinio - dVar4 * 0.75) * dVar5 *
                 (eosq + eosq + 1.0) * 2.1460748e-06;
    (this->deepspace_consts_).del2 =
         ((eosq * 0.8125 + -2.5) * eosq + 1.0) * dVar4 * dVar4 * 0.75 * (dVar5 + dVar5) *
         1.7891679e-06;
    dVar3 = ((this->elements_).mean_anomoly_ + (this->elements_).ascending_node_ +
            (this->elements_).argument_perigee_) - (this->deepspace_consts_).gsto;
    dVar4 = floor(dVar3 / 6.283185307179586);
    (this->deepspace_consts_).xlamo = dVar4 * -6.283185307179586 + dVar3;
    dVar8 = dVar33 + omgdot + xnodot + xmdot + -0.0043752690880113 + dVar8;
  }
  (this->deepspace_consts_).xfact = (dVar42 + dVar8) - dVar16;
  (this->integrator_params_).atime = 0.0;
  (this->integrator_params_).xni = dVar16;
  (this->integrator_params_).xli = (this->deepspace_consts_).xlamo;
  return;
}

Assistant:

void SGP4::DeepSpaceInitialise(
        const double eosq,
        const double sinio,
        const double cosio,
        const double betao,
        const double theta2,
        const double betao2,
        const double xmdot,
        const double omgdot,
        const double xnodot)
{
    double se = 0.0;
    double si = 0.0;
    double sl = 0.0;
    double sgh = 0.0;
    double shdq = 0.0;

    double bfact = 0.0;

    static const double ZNS = 1.19459E-5;
    static const double C1SS = 2.9864797E-6;
    static const double ZES = 0.01675;
    static const double ZNL = 1.5835218E-4;
    static const double C1L = 4.7968065E-7;
    static const double ZEL = 0.05490;
    static const double ZCOSIS = 0.91744867;
    static const double ZSINI = 0.39785416;
    static const double ZSINGS = -0.98088458;
    static const double ZCOSGS = 0.1945905;
    static const double Q22 = 1.7891679E-6;
    static const double Q31 = 2.1460748E-6;
    static const double Q33 = 2.2123015E-7;
    static const double ROOT22 = 1.7891679E-6;
    static const double ROOT32 = 3.7393792E-7;
    static const double ROOT44 = 7.3636953E-9;
    static const double ROOT52 = 1.1428639E-7;
    static const double ROOT54 = 2.1765803E-9;

    const double aqnv = 1.0 / elements_.RecoveredSemiMajorAxis();
    const double xpidot = omgdot + xnodot;
    const double sinq = sin(elements_.AscendingNode());
    const double cosq = cos(elements_.AscendingNode());
    const double sing = sin(elements_.ArgumentPerigee());
    const double cosg = cos(elements_.ArgumentPerigee());

    /*
     * initialize lunar / solar terms
     */
    const double jday = elements_.Epoch().ToJ2000();

    const double xnodce = Util::WrapTwoPI(4.5236020 - 9.2422029e-4 * jday);
    const double stem = sin(xnodce);
    const double ctem = cos(xnodce);
    const double zcosil = 0.91375164 - 0.03568096 * ctem;
    const double zsinil = sqrt(1.0 - zcosil * zcosil);
    const double zsinhl = 0.089683511 * stem / zsinil;
    const double zcoshl = sqrt(1.0 - zsinhl * zsinhl);
    const double c = 4.7199672 + 0.22997150 * jday;
    const double gam = 5.8351514 + 0.0019443680 * jday;
    deepspace_consts_.zmol = Util::WrapTwoPI(c - gam);
    double zx = 0.39785416 * stem / zsinil;
    double zy = zcoshl * ctem + 0.91744867 * zsinhl * stem;
    zx = atan2(zx, zy);
    zx = gam + zx - xnodce;

    const double zcosgl = cos(zx);
    const double zsingl = sin(zx);
    deepspace_consts_.zmos = Util::WrapTwoPI(6.2565837 + 0.017201977 * jday);

    /*
     * do solar terms
     */
    double zcosg = ZCOSGS;
    double zsing = ZSINGS;
    double zcosi = ZCOSIS;
    double zsini = ZSINI;
    double zcosh = cosq;
    double zsinh = sinq;
    double cc = C1SS;
    double zn = ZNS;
    double ze = ZES;
    const double xnoi = 1.0 / elements_.RecoveredMeanMotion();

    for (int cnt = 0; cnt < 2; cnt++)
    {
        /*
         * solar terms are done a second time after lunar terms are done
         */
        const double a1 = zcosg * zcosh + zsing * zcosi * zsinh;
        const double a3 = -zsing * zcosh + zcosg * zcosi * zsinh;
        const double a7 = -zcosg * zsinh + zsing * zcosi * zcosh;
        const double a8 = zsing * zsini;
        const double a9 = zsing * zsinh + zcosg * zcosi*zcosh;
        const double a10 = zcosg * zsini;
        const double a2 = cosio * a7 + sinio * a8;
        const double a4 = cosio * a9 + sinio * a10;
        const double a5 = -sinio * a7 + cosio * a8;
        const double a6 = -sinio * a9 + cosio * a10;
        const double x1 = a1 * cosg + a2 * sing;
        const double x2 = a3 * cosg + a4 * sing;
        const double x3 = -a1 * sing + a2 * cosg;
        const double x4 = -a3 * sing + a4 * cosg;
        const double x5 = a5 * sing;
        const double x6 = a6 * sing;
        const double x7 = a5 * cosg;
        const double x8 = a6 * cosg;
        const double z31 = 12.0 * x1 * x1 - 3. * x3 * x3;
        const double z32 = 24.0 * x1 * x2 - 6. * x3 * x4;
        const double z33 = 12.0 * x2 * x2 - 3. * x4 * x4;
        double z1 = 3.0 * (a1 * a1 + a2 * a2) + z31 * eosq;
        double z2 = 6.0 * (a1 * a3 + a2 * a4) + z32 * eosq;
        double z3 = 3.0 * (a3 * a3 + a4 * a4) + z33 * eosq;

        const double z11 = -6.0 * a1 * a5
            + eosq * (-24. * x1 * x7 - 6. * x3 * x5);
        const double z12 = -6.0 * (a1 * a6 + a3 * a5) 
            + eosq * (-24. * (x2 * x7 + x1 * x8) - 6. * (x3 * x6 + x4 * x5));
        const double z13 = -6.0 * a3 * a6
            + eosq * (-24. * x2 * x8 - 6. * x4 * x6);
        const double z21 = 6.0 * a2 * a5
            + eosq * (24. * x1 * x5 - 6. * x3 * x7);
        const double z22 = 6.0 * (a4 * a5 + a2 * a6)
            + eosq * (24. * (x2 * x5 + x1 * x6) - 6. * (x4 * x7 + x3 * x8));
        const double z23 = 6.0 * a4 * a6
            + eosq * (24. * x2 * x6 - 6. * x4 * x8);

        z1 = z1 + z1 + betao2 * z31;
        z2 = z2 + z2 + betao2 * z32;
        z3 = z3 + z3 + betao2 * z33;

        const double s3 = cc * xnoi;
        const double s2 = -0.5 * s3 / betao;
        const double s4 = s3 * betao;
        const double s1 = -15.0 * elements_.Eccentricity() * s4;
        const double s5 = x1 * x3 + x2 * x4;
        const double s6 = x2 * x3 + x1 * x4;
        const double s7 = x2 * x4 - x1 * x3;

        se = s1 * zn * s5;
        si = s2 * zn * (z11 + z13);
        sl = -zn * s3 * (z1 + z3 - 14.0 - 6.0 * eosq);
        sgh = s4 * zn * (z31 + z33 - 6.0);

        /*
         * replaced
         * sh = -zn * s2 * (z21 + z23
         * with
         * shdq = (-zn * s2 * (z21 + z23)) / sinio
         */
        if (elements_.Inclination() < 5.2359877e-2
                || elements_.Inclination() > kPI - 5.2359877e-2)
        {
            shdq = 0.0;
        }
        else
        {
            shdq = (-zn * s2 * (z21 + z23)) / sinio;
        }

        deepspace_consts_.ee2 = 2.0 * s1 * s6;
        deepspace_consts_.e3 = 2.0 * s1 * s7;
        deepspace_consts_.xi2 = 2.0 * s2 * z12;
        deepspace_consts_.xi3 = 2.0 * s2 * (z13 - z11);
        deepspace_consts_.xl2 = -2.0 * s3 * z2;
        deepspace_consts_.xl3 = -2.0 * s3 * (z3 - z1);
        deepspace_consts_.xl4 = -2.0 * s3 * (-21.0 - 9.0 * eosq) * ze;
        deepspace_consts_.xgh2 = 2.0 * s4 * z32;
        deepspace_consts_.xgh3 = 2.0 * s4 * (z33 - z31);
        deepspace_consts_.xgh4 = -18.0 * s4 * ze;
        deepspace_consts_.xh2 = -2.0 * s2 * z22;
        deepspace_consts_.xh3 = -2.0 * s2 * (z23 - z21);

        if (cnt == 1)
        {
            break;
        }
        /*
         * do lunar terms
         */
        deepspace_consts_.sse = se;
        deepspace_consts_.ssi = si;
        deepspace_consts_.ssl = sl;
        deepspace_consts_.ssh = shdq;
        deepspace_consts_.ssg = sgh - cosio * deepspace_consts_.ssh;
        deepspace_consts_.se2 = deepspace_consts_.ee2;
        deepspace_consts_.si2 = deepspace_consts_.xi2;
        deepspace_consts_.sl2 = deepspace_consts_.xl2;
        deepspace_consts_.sgh2 = deepspace_consts_.xgh2;
        deepspace_consts_.sh2 = deepspace_consts_.xh2;
        deepspace_consts_.se3 = deepspace_consts_.e3;
        deepspace_consts_.si3 = deepspace_consts_.xi3;
        deepspace_consts_.sl3 = deepspace_consts_.xl3;
        deepspace_consts_.sgh3 = deepspace_consts_.xgh3;
        deepspace_consts_.sh3 = deepspace_consts_.xh3;
        deepspace_consts_.sl4 = deepspace_consts_.xl4;
        deepspace_consts_.sgh4 = deepspace_consts_.xgh4;
        zcosg = zcosgl;
        zsing = zsingl;
        zcosi = zcosil;
        zsini = zsinil;
        zcosh = zcoshl * cosq + zsinhl * sinq;
        zsinh = sinq * zcoshl - cosq * zsinhl;
        zn = ZNL;
        cc = C1L;
        ze = ZEL;
    }

    deepspace_consts_.sse += se;
    deepspace_consts_.ssi += si;
    deepspace_consts_.ssl += sl;
    deepspace_consts_.ssg += sgh - cosio * shdq;
    deepspace_consts_.ssh += shdq;

    deepspace_consts_.shape = DeepSpaceConstants::NONE;

    if (elements_.RecoveredMeanMotion() < 0.0052359877
            && elements_.RecoveredMeanMotion() > 0.0034906585)
    {
        /*
         * 24h synchronous resonance terms initialisation
         */
        deepspace_consts_.shape = DeepSpaceConstants::SYNCHRONOUS;

        const double g200 = 1.0 + eosq * (-2.5 + 0.8125 * eosq);
        const double g310 = 1.0 + 2.0 * eosq;
        const double g300 = 1.0 + eosq * (-6.0 + 6.60937 * eosq);
        const double f220 = 0.75 * (1.0 + cosio) * (1.0 + cosio);
        const double f311 = 0.9375 * sinio * sinio * (1.0 + 3.0 * cosio)
            - 0.75 * (1.0 + cosio);
        double f330 = 1.0 + cosio;
        f330 = 1.875 * f330 * f330 * f330;
        deepspace_consts_.del1 = 3.0 * elements_.RecoveredMeanMotion()
            * elements_.RecoveredMeanMotion()
            * aqnv * aqnv;
        deepspace_consts_.del2 = 2.0 * deepspace_consts_.del1
            * f220 * g200 * Q22;
        deepspace_consts_.del3 = 3.0 * deepspace_consts_.del1
            * f330 * g300 * Q33 * aqnv;
        deepspace_consts_.del1 = deepspace_consts_.del1
            * f311 * g310 * Q31 * aqnv;

        deepspace_consts_.xlamo = Util::WrapTwoPI(elements_.MeanAnomoly()
                + elements_.AscendingNode()
                + elements_.ArgumentPerigee()
                - deepspace_consts_.gsto);
        bfact = xmdot + xpidot - kTHDT
            + deepspace_consts_.ssl
            + deepspace_consts_.ssg
            + deepspace_consts_.ssh;
    }
    else if (elements_.RecoveredMeanMotion() < 8.26e-3
            || elements_.RecoveredMeanMotion() > 9.24e-3
            || elements_.Eccentricity() < 0.5)
    {
        // do nothing
    }
    else
    {
        /*
         * geopotential resonance initialisation for 12 hour orbits
         */
        deepspace_consts_.shape = DeepSpaceConstants::RESONANCE;

        double g211;
        double g310;
        double g322;
        double g410;
        double g422;
        double g520;

        double g201 = -0.306 - (elements_.Eccentricity() - 0.64) * 0.440;

        if (elements_.Eccentricity() <= 0.65)
        {
            g211 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    3.616, -13.247, 16.290, 0.0);
            g310 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -19.302, 117.390, -228.419, 156.591);
            g322 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -18.9068, 109.7927, -214.6334, 146.5816);
            g410 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -41.122, 242.694, -471.094, 313.953);
            g422 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -146.407, 841.880, -1629.014, 1083.435);
            g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -532.114, 3017.977, -5740.032, 3708.276);
        }
        else
        {
            g211 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -72.099, 331.819, -508.738, 266.724);
            g310 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -346.844, 1582.851, -2415.925, 1246.113);
            g322 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -342.585, 1554.908, -2366.899, 1215.972);
            g410 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -1052.797, 4758.686, -7193.992, 3651.957);
            g422 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -3581.69, 16178.11, -24462.77, 12422.52);

            if (elements_.Eccentricity() <= 0.715)
            {
                g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                        1464.74, -4664.75, 3763.64, 0.0);
            }
            else
            {
                g520 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                        -5149.66, 29936.92, -54087.36, 31324.56);
            }
        }

        double g533;
        double g521;
        double g532;

        if (elements_.Eccentricity() < 0.7)
        {
            g533 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -919.2277, 4988.61, -9064.77, 5542.21);
            g521 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -822.71072, 4568.6173, -8491.4146, 5337.524);
            g532 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -853.666, 4690.25, -8624.77, 5341.4);
        }
        else
        {
            g533 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -37995.78, 161616.52, -229838.2, 109377.94);
            g521 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -51752.104, 218913.95, -309468.16, 146349.42);
            g532 = EvaluateCubicPolynomial(elements_.Eccentricity(),
                    -40023.88, 170470.89, -242699.48, 115605.82);
        }

        const double sini2 = sinio * sinio;
        const double f220 = 0.75 * (1.0 + 2.0 * cosio + theta2);
        const double f221 = 1.5 * sini2;
        const double f321 = 1.875 * sinio * (1.0 - 2.0 * cosio - 3.0 * theta2);
        const double f322 = -1.875 * sinio * (1.0 + 2.0 * cosio - 3.0 * theta2);
        const double f441 = 35.0 * sini2 * f220;
        const double f442 = 39.3750 * sini2 * sini2;
        const double f522 = 9.84375 * sinio
            * (sini2 * (1.0 - 2.0 * cosio - 5.0 * theta2)
                + 0.33333333 * (-2.0 + 4.0 * cosio + 6.0 * theta2));
        const double f523 = sinio
            * (4.92187512 * sini2 * (-2.0 - 4.0 * cosio + 10.0 * theta2)
                + 6.56250012 * (1.0 + 2.0 * cosio - 3.0 * theta2));
        const double f542 = 29.53125 * sinio * (2.0 - 8.0 * cosio + theta2 *
                (-12.0 + 8.0 * cosio + 10.0 * theta2));
        const double f543 = 29.53125 * sinio * (-2.0 - 8.0 * cosio + theta2 *
                (12.0 + 8.0 * cosio - 10.0 * theta2));

        const double xno2 = elements_.RecoveredMeanMotion()
            * elements_.RecoveredMeanMotion();
        const double ainv2 = aqnv * aqnv;

        double temp1 = 3.0 * xno2 * ainv2;
        double temp = temp1 * ROOT22;
        deepspace_consts_.d2201 = temp * f220 * g201;
        deepspace_consts_.d2211 = temp * f221 * g211;

        temp1 *= aqnv;
        temp = temp1 * ROOT32;
        deepspace_consts_.d3210 = temp * f321 * g310;
        deepspace_consts_.d3222 = temp * f322 * g322;

        temp1 *= aqnv;
        temp = 2.0 * temp1 * ROOT44;
        deepspace_consts_.d4410 = temp * f441 * g410;
        deepspace_consts_.d4422 = temp * f442 * g422;

        temp1 *= aqnv;
        temp = temp1 * ROOT52;
        deepspace_consts_.d5220 = temp * f522 * g520;
        deepspace_consts_.d5232 = temp * f523 * g532;

        temp = 2.0 * temp1 * ROOT54;
        deepspace_consts_.d5421 = temp * f542 * g521;
        deepspace_consts_.d5433 = temp * f543 * g533;

        deepspace_consts_.xlamo = Util::WrapTwoPI(
                elements_.MeanAnomoly()
                + elements_.AscendingNode()
                + elements_.AscendingNode()
                - deepspace_consts_.gsto
                - deepspace_consts_.gsto);
        bfact = xmdot
            + xnodot + xnodot
            - kTHDT - kTHDT
            + deepspace_consts_.ssl
            + deepspace_consts_.ssh
            + deepspace_consts_.ssh;
    }

    if (deepspace_consts_.shape != DeepSpaceConstants::NONE)
    {
        /*
         * initialise integrator
         */
        deepspace_consts_.xfact = bfact - elements_.RecoveredMeanMotion();
        integrator_params_.atime = 0.0;
        integrator_params_.xni = elements_.RecoveredMeanMotion();
        integrator_params_.xli = deepspace_consts_.xlamo;
    }
}